

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O3

REF_STATUS
ref_facelift_eval_at
          (REF_FACELIFT ref_facelift,REF_INT type,REF_INT id,REF_DBL *params,REF_DBL *xyz,
          REF_DBL *dxyz_dtuv)

{
  REF_DBL *pRVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  ulong uVar5;
  char *pcVar6;
  REF_CELL ref_cell;
  double dVar7;
  REF_INT cell;
  REF_DBL clip [3];
  REF_DBL bary [3];
  REF_DBL displacement [3];
  REF_INT nodes [27];
  int local_1d4;
  REF_NODE local_1d0;
  REF_DBL local_1c8 [4];
  REF_DBL local_1a8 [4];
  double local_188 [28];
  REF_INT local_a8 [30];
  
  uVar2 = ref_egads_eval_at(ref_facelift->grid->geom,type,id,params,xyz,dxyz_dtuv);
  if (uVar2 == 0) {
    if (type == 0) {
      return 0;
    }
    if (ref_facelift->displacement != (REF_DBL *)0x0) {
      uVar2 = ref_facelift_displacement_at(ref_facelift,type,id,params,local_188);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x2e7,"ref_facelift_eval_at",(ulong)uVar2,"facelift displacement");
        return uVar2;
      }
      *xyz = *xyz + local_188[0];
      xyz[1] = xyz[1] + local_188[1];
      xyz[2] = local_188[2] + xyz[2];
      return 0;
    }
    local_1d0 = ref_facelift->grid->node;
    uVar2 = ref_facelift_enclosing(ref_facelift,type,id,params,&local_1d4,local_1a8);
    if (uVar2 != 0) {
      pcVar6 = "enclose";
      uVar4 = 0x2cb;
      goto LAB_001f162d;
    }
    if (local_1d4 == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x2d1,"ref_facelift_eval_at","no enclosing found");
      if (type == 2) {
        printf("faceid %d parms %.15e %.15e\n",*params,params[1],(ulong)(uint)id);
        return 1;
      }
      if (type != 1) {
        return 1;
      }
      printf("edgeid %d parms %.15e\n",*params,(ulong)(uint)id);
      return 1;
    }
    if (type == 2) {
      ref_cell = ref_facelift->tri_cell;
      uVar2 = ref_node_clip_bary3(local_1a8,local_1c8);
      if (uVar2 != 0) {
        pcVar6 = "clip face bary";
        uVar4 = 0x2d8;
        goto LAB_001f162d;
      }
    }
    else {
      if (type != 1) goto LAB_001f1860;
      ref_cell = ref_facelift->edg_cell;
      uVar2 = ref_node_clip_bary2(local_1a8,local_1c8);
      if (uVar2 != 0) {
        pcVar6 = "clip edge bary";
        uVar4 = 0x2d4;
        goto LAB_001f162d;
      }
    }
    if (ref_cell == (REF_CELL)0x0) {
LAB_001f1860:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x2da,"ref_facelift_eval_at","ref_cell NULL, protect dereference");
      return 2;
    }
    uVar2 = ref_cell_shape(ref_cell->type,local_1c8,local_188);
    if (uVar2 == 0) {
      uVar2 = ref_cell_nodes(ref_cell,local_1d4,local_a8);
      if (uVar2 == 0) {
        uVar2 = ref_cell->node_per;
        lVar3 = 0;
        do {
          xyz[lVar3] = 0.0;
          if (0 < (int)uVar2) {
            pRVar1 = local_1d0->real;
            dVar7 = 0.0;
            uVar5 = 0;
            do {
              dVar7 = dVar7 + local_188[uVar5] *
                              pRVar1[(long)local_a8[uVar5] * 0xf + (long)(int)lVar3];
              xyz[lVar3] = dVar7;
              uVar5 = uVar5 + 1;
            } while (uVar2 != uVar5);
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        return 0;
      }
      pcVar6 = "nodes";
      uVar4 = 0x2dc;
    }
    else {
      pcVar6 = "shape";
      uVar4 = 0x2db;
    }
  }
  else {
    pcVar6 = "egads eval";
    uVar4 = 0x2c2;
  }
LAB_001f162d:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",uVar4,
         "ref_facelift_eval_at",(ulong)uVar2,pcVar6);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_eval_at(REF_FACELIFT ref_facelift, REF_INT type,
                                        REF_INT id, REF_DBL *params,
                                        REF_DBL *xyz, REF_DBL *dxyz_dtuv) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_DBL displacement[3];
  RSS(ref_egads_eval_at(ref_geom, type, id, params, xyz, dxyz_dtuv),
      "egads eval");
  if (REF_GEOM_NODE == type) return REF_SUCCESS;
  if (ref_facelift_direct(ref_facelift)) {
    REF_NODE ref_node = ref_grid_node(ref_facelift_grid(ref_facelift));
    REF_INT i, cell_node, cell, nodes[REF_CELL_MAX_SIZE_PER];
    REF_DBL bary[3], clip[3];
    REF_DBL shape[REF_CELL_MAX_NODE_PER];
    REF_CELL ref_cell = NULL;
    RSS(ref_facelift_enclosing(ref_facelift, type, id, params, &cell, bary),
        "enclose");
    RUB(REF_EMPTY, cell, "no enclosing found", {
      if (REF_GEOM_EDGE == type)
        printf("edgeid %d parms %.15e\n", id, params[0]);
      if (REF_GEOM_FACE == type)
        printf("faceid %d parms %.15e %.15e\n", id, params[0], params[1]);
    });
    if (REF_GEOM_EDGE == type) {
      ref_cell = ref_facelift_edg(ref_facelift);
      RSS(ref_node_clip_bary2(bary, clip), "clip edge bary");
    }
    if (REF_GEOM_FACE == type) {
      ref_cell = ref_facelift_tri(ref_facelift);
      RSS(ref_node_clip_bary3(bary, clip), "clip face bary");
    }
    RNS(ref_cell, "ref_cell NULL, protect dereference");
    RSS(ref_cell_shape(ref_cell_type(ref_cell), clip, shape), "shape");
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    for (i = 0; i < 3; i++) {
      xyz[i] = 0.0;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        xyz[i] +=
            shape[cell_node] * ref_node_xyz(ref_node, i, nodes[cell_node]);
      }
    }
  } else {
    RSS(ref_facelift_displacement_at(ref_facelift, type, id, params,
                                     displacement),
        "facelift displacement");
    xyz[0] += displacement[0];
    xyz[1] += displacement[1];
    xyz[2] += displacement[2];
  }
  return REF_SUCCESS;
}